

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicMaxCase::ShaderAtomicMaxCase
          (ShaderAtomicMaxCase *this,Context *context,char *name,AtomicOperandType operandType,
          DataType type,Precision precision)

{
  deUint32 local_6c;
  undefined1 local_38 [7];
  bool isSigned;
  Precision local_2c;
  DataType local_28;
  Precision precision_local;
  DataType type_local;
  AtomicOperandType operandType_local;
  char *name_local;
  Context *context_local;
  ShaderAtomicMaxCase *this_local;
  
  local_2c = precision;
  local_28 = type;
  precision_local = operandType;
  _type_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)local_38,3,2,1);
  ShaderAtomicOpCase::ShaderAtomicOpCase
            (&this->super_ShaderAtomicOpCase,context,name,"atomicMax",operandType,type,precision,
             (UVec3 *)local_38);
  (this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderAtomicMaxCase_011c1c08;
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_INT) {
    local_6c = 0xfffffc18;
    if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_LOWP) {
      local_6c = 0xffffff9c;
    }
  }
  else {
    local_6c = 0;
  }
  (this->super_ShaderAtomicOpCase).m_initialValue = local_6c;
  return;
}

Assistant:

ShaderAtomicMaxCase (Context& context, const char* name, AtomicOperandType operandType, DataType type, Precision precision)
		: ShaderAtomicOpCase(context, name, "atomicMax", operandType, type, precision, UVec3(3,2,1))
	{
		const bool isSigned = m_type == TYPE_INT;
		m_initialValue = isSigned ? (m_precision == PRECISION_LOWP ? -100 : -1000) : 0;
	}